

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-time-dependent.h
# Opt level: O2

void __thiscall
dynamicgraph::SignalTimeDependent<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_int>::SignalTimeDependent
          (SignalTimeDependent<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_int> *this,
          function2<Eigen::Matrix<double,__1,_1,_0,__1,_1>_&,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_&,_int>
          *t,SignalArray_const<int> *sig,string *name)

{
  undefined1 *this_00;
  function2<Eigen::Matrix<double,__1,_1,_0,__1,_1>_&,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_&,_int>
  local_70;
  string local_50;
  
  this_00 = &this->field_0x40;
  std::__cxx11::string::string((string *)&local_50,(string *)name);
  Signal<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_int>::Signal
            ((Signal<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_int> *)this_00,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  (this->super_TimeDependency<int>)._vptr_TimeDependency = (_func_int **)0x12c790;
  *(undefined8 *)&this->field_0x40 = 0x12c900;
  TimeDependency<int>::TimeDependency
            (&this->super_TimeDependency<int>,(SignalBase<int> *)this_00,sig,TIME_DEPENDENT);
  (this->super_TimeDependency<int>)._vptr_TimeDependency = (_func_int **)0x12c790;
  *(undefined8 *)&this->field_0x40 = 0x12c900;
  boost::
  function2<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_&,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_&,_int>
  ::function2(&local_70,t);
  (**(code **)(*(long *)this_00 + 0xd8))(this_00,&local_70,0);
  boost::
  function2<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_&,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_&,_int>
  ::~function2(&local_70);
  return;
}

Assistant:

SignalTimeDependent<T, Time>::SignalTimeDependent(
    boost::function2<T &, T &, Time> t, const SignalArray_const<Time> &sig,
    std::string name)
    : Signal<T, Time>(name), TimeDependency<Time>(this, sig) {
  this->setFunction(t);
}